

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     popa<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Context *context)

{
  uint16_t *puVar1;
  unsigned_short uVar2;
  
  uVar2 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  (context->registers).di_ = uVar2;
  uVar2 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  (context->registers).si_ = uVar2;
  uVar2 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  (context->registers).bp_ = uVar2;
  puVar1 = &(context->registers).sp_;
  *puVar1 = *puVar1 + 2;
  uVar2 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  (context->registers).bx_.full = uVar2;
  uVar2 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  (context->registers).dx_.full = uVar2;
  uVar2 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  (context->registers).cx_.full = uVar2;
  uVar2 = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (context);
  (context->registers).ax_.full = uVar2;
  return;
}

Assistant:

void popa(
	ContextT &context
) {
	context.memory.preauthorise_stack_read(sizeof(IntT) * 8);
	if constexpr (std::is_same_v<IntT, uint32_t>) {
		context.registers.edi() = pop<uint32_t, true>(context);
		context.registers.esi() = pop<uint32_t, true>(context);
		context.registers.ebp() = pop<uint32_t, true>(context);
		context.registers.esp() += 4;
		context.registers.ebx() = pop<uint32_t, true>(context);
		context.registers.edx() = pop<uint32_t, true>(context);
		context.registers.ecx() = pop<uint32_t, true>(context);
		context.registers.eax() = pop<uint32_t, true>(context);
	} else {
		context.registers.di() = pop<uint16_t, true>(context);
		context.registers.si() = pop<uint16_t, true>(context);
		context.registers.bp() = pop<uint16_t, true>(context);
		context.registers.sp() += 2;
		context.registers.bx() = pop<uint16_t, true>(context);
		context.registers.dx() = pop<uint16_t, true>(context);
		context.registers.cx() = pop<uint16_t, true>(context);
		context.registers.ax() = pop<uint16_t, true>(context);
	}
}